

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Vec2<double>_> *this,OStream *os,int version)

{
  double local_20;
  
  local_20 = (this->_value).x;
  (*os->_vptr_OStream[2])(os,&local_20,8);
  local_20 = (this->_value).y;
  (*os->_vptr_OStream[2])(os,&local_20,8);
  return;
}

Assistant:

IMF_EXPORT void
V2dAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.x);
    Xdr::write<StreamIO> (os, _value.y);
}